

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane-test.c++
# Opt level: O2

Maybe<capnp::Capability::Client> * __thiscall
capnp::_::anon_unknown_0::MembranePolicyImpl::outboundCall
          (Maybe<capnp::Capability::Client> *__return_storage_ptr__,MembranePolicyImpl *this,
          uint64_t interfaceId,uint16_t methodId,Client target)

{
  undefined6 in_register_0000000a;
  Own<capnp::_::(anonymous_namespace)::ThingImpl> local_28;
  Own<capnp::ClientHook> local_18;
  
  if ((int)CONCAT62(in_register_0000000a,methodId) == 1 && interfaceId == 0x9352e4e41f173917) {
    local_28.ptr = (ThingImpl *)operator_new(0x28);
    *(undefined8 *)&(local_28.ptr)->field_0x20 = 0;
    ((local_28.ptr)->super_Server)._vptr_Server = (_func_int **)0x659960;
    *(undefined8 *)&(local_28.ptr)->field_0x18 = 0x659990;
    *(char **)&((local_28.ptr)->super_Server).field_0x8 = "outbound";
    *(undefined8 *)&((local_28.ptr)->super_Server).field_0x10 = 9;
    local_28.disposer =
         (Disposer *)&kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::ThingImpl>::instance;
    Capability::Client::Client<capnp::_::(anonymous_namespace)::ThingImpl,void>
              ((Client *)&local_18,&local_28);
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.hook.disposer = local_18.disposer;
    (__return_storage_ptr__->ptr).field_1.value.hook.ptr = local_18.ptr;
    local_18.ptr = (ClientHook *)0x0;
    kj::Own<capnp::ClientHook>::dispose(&local_18);
    kj::Own<capnp::_::(anonymous_namespace)::ThingImpl>::~Own(&local_28);
  }
  else {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Capability::Client> outboundCall(uint64_t interfaceId, uint16_t methodId,
                                             Capability::Client target) override {
    if (interfaceId == capnp::typeId<Thing>() && methodId == 1) {
      return Capability::Client(kj::heap<ThingImpl>("outbound"));
    } else {
      return nullptr;
    }
  }